

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,StringMatcher *matcher)

{
  int iVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  undefined4 extraout_var;
  string exceptionMessage;
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  expr;
  long *local_58 [2];
  long local_48 [2];
  undefined **local_38;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 *local_28;
  StringMatcher *local_20;
  
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar1 = (*(pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[5])(pSVar2);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
            (local_58,(long *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(matcher->super_MatcherUntypedBase)._vptr_MatcherUntypedBase[3])(matcher,local_58);
  local_30 = 1;
  local_2f = (undefined1)iVar1;
  local_38 = &PTR_streamReconstructedExpression_00327480;
  local_28 = (undefined1 *)local_58;
  local_20 = matcher;
  (*handler->m_resultCapture->_vptr_IResultCapture[0x10])
            (handler->m_resultCapture,handler,&local_38,&handler->m_reaction);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, StringMatcher const& matcher ) {
        std::string exceptionMessage = Catch::translateActiveException();
        MatchExpr<std::string, StringMatcher const&> expr( CATCH_MOVE(exceptionMessage), matcher );
        handler.handleExpr( expr );
    }